

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_ghost_long(REF_CELL ref_cell,REF_NODE ref_node,REF_LONG *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_MPI ref_mpi;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  REF_STATUS RVar7;
  uint uVar8;
  REF_INT *pRVar9;
  long lVar10;
  long lVar11;
  void *pvVar12;
  void *pvVar13;
  ulong uVar14;
  undefined8 uVar15;
  char *pcVar16;
  REF_INT *pRVar17;
  ulong uVar18;
  int iVar19;
  REF_INT local;
  REF_INT nodes [27];
  int local_110;
  int local_10c;
  REF_INT *local_108;
  REF_INT *local_100;
  void *local_f8;
  REF_NODE local_f0;
  void *local_e8;
  void *local_e0;
  REF_INT local_d4;
  void *local_d0;
  int *local_c8;
  void *local_c0;
  REF_LONG *local_b8;
  ulong local_b0;
  REF_INT local_a8 [30];
  
  ref_mpi = ref_node->ref_mpi;
  if ((long)ref_mpi->n < 2) {
    return 0;
  }
  local_f0 = ref_node;
  pRVar9 = (REF_INT *)malloc((long)ref_mpi->n << 2);
  if (pRVar9 == (REF_INT *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x572,
           "ref_cell_ghost_long","malloc a_size of REF_INT NULL");
    pRVar17 = (REF_INT *)0x0;
  }
  else {
    pRVar17 = pRVar9;
    if (0 < ref_mpi->n) {
      lVar10 = 0;
      do {
        pRVar9[lVar10] = 0;
        lVar10 = lVar10 + 1;
      } while (lVar10 < ref_mpi->n);
    }
  }
  if (pRVar9 == (REF_INT *)0x0) {
    return 2;
  }
  if ((long)ref_mpi->n < 0) {
    RVar7 = 1;
    pcVar16 = "malloc b_size of REF_INT negative";
LAB_00121427:
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x573,
           "ref_cell_ghost_long",pcVar16);
    local_108 = (REF_INT *)0x0;
  }
  else {
    local_108 = (REF_INT *)malloc((long)ref_mpi->n << 2);
    RVar7 = 2;
    if (local_108 == (REF_INT *)0x0) {
      pcVar16 = "malloc b_size of REF_INT NULL";
      goto LAB_00121427;
    }
    bVar4 = true;
    if (0 < ref_mpi->n) {
      lVar10 = 0;
      do {
        local_108[lVar10] = 0;
        lVar10 = lVar10 + 1;
      } while (lVar10 < ref_mpi->n);
    }
  }
  if (!bVar4) {
    return RVar7;
  }
  local_100 = pRVar17;
  local_b8 = data;
  if (ref_cell->max < 1) {
    iVar19 = 0;
  }
  else {
    iVar19 = 0;
    do {
      if (ref_cell->c2n[(long)iVar19 * (long)ref_cell->size_per] != -1) {
        uVar5 = ref_cell_part(ref_cell,local_f0,iVar19,&local_110);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x576,"ref_cell_ghost_long",(ulong)uVar5,"cell part");
          return uVar5;
        }
        if (local_110 != ref_mpi->id) {
          local_100[local_110] = local_100[local_110] + 1;
        }
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 < ref_cell->max);
  }
  pRVar9 = local_100;
  local_10c = iVar19;
  uVar5 = ref_mpi_alltoall(ref_mpi,local_100,local_108,1);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x57b,
           "ref_cell_ghost_long",(ulong)uVar5,"alltoall sizes");
    return uVar5;
  }
  iVar19 = ref_mpi->n;
  lVar10 = (long)iVar19;
  if (lVar10 < 1) {
    uVar5 = 0;
    local_110 = 0;
  }
  else {
    lVar11 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + pRVar9[lVar11];
      lVar11 = lVar11 + 1;
      local_110 = iVar19;
    } while (lVar10 != lVar11);
  }
  iVar1 = ref_cell->node_per;
  uVar6 = iVar1 * uVar5;
  if ((int)uVar6 < 0) {
    pcVar16 = "malloc a_nodes of REF_GLOB negative";
    uVar15 = 0x57f;
LAB_00121693:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar15,
           "ref_cell_ghost_long",pcVar16);
    RVar7 = 1;
  }
  else {
    pvVar12 = malloc((ulong)uVar6 << 3);
    if (pvVar12 == (void *)0x0) {
      pcVar16 = "malloc a_nodes of REF_GLOB NULL";
      uVar15 = 0x57f;
    }
    else {
      if ((int)uVar5 < 0) {
        pcVar16 = "malloc a_data of REF_LONG negative";
        uVar15 = 0x580;
        goto LAB_00121693;
      }
      local_f8 = (void *)CONCAT44(local_f8._4_4_,iVar1);
      pvVar13 = malloc((ulong)uVar5 * 8);
      if (pvVar13 == (void *)0x0) {
        pcVar16 = "malloc a_data of REF_LONG NULL";
        uVar15 = 0x580;
      }
      else {
        local_c0 = pvVar13;
        pvVar13 = malloc((ulong)uVar5 << 2);
        if (pvVar13 == (void *)0x0) {
          pcVar16 = "malloc a_cell of REF_INT NULL";
          uVar15 = 0x581;
        }
        else {
          if (iVar19 < 1) {
            uVar6 = 0;
            local_110 = 0;
          }
          else {
            lVar11 = 0;
            uVar6 = 0;
            do {
              uVar6 = uVar6 + local_108[lVar11];
              lVar11 = lVar11 + 1;
              local_110 = iVar19;
            } while (lVar10 != lVar11);
          }
          local_e0 = pvVar12;
          if ((int)((int)local_f8 * uVar6) < 0) {
            pcVar16 = "malloc b_nodes of REF_GLOB negative";
            uVar15 = 0x585;
            goto LAB_00121693;
          }
          pvVar12 = malloc((ulong)((int)local_f8 * uVar6) << 3);
          if (pvVar12 == (void *)0x0) {
            pcVar16 = "malloc b_nodes of REF_GLOB NULL";
            uVar15 = 0x585;
          }
          else {
            if ((int)uVar6 < 0) {
              pcVar16 = "malloc b_data of REF_LONG negative";
              uVar15 = 0x586;
              goto LAB_00121693;
            }
            local_f8 = pvVar12;
            pvVar12 = malloc((ulong)uVar6 << 3);
            if (pvVar12 == (void *)0x0) {
              pcVar16 = "malloc b_data of REF_LONG NULL";
              uVar15 = 0x586;
            }
            else {
              if (iVar19 < 0) {
                pcVar16 = "malloc a_next of REF_INT negative";
                uVar15 = 0x588;
                goto LAB_00121693;
              }
              local_e8 = pvVar12;
              local_c8 = (int *)malloc(lVar10 * 4);
              if (local_c8 != (int *)0x0) {
                *local_c8 = 0;
                lVar11 = 1;
                if (1 < iVar19) {
                  iVar19 = *local_c8;
                  lVar11 = 1;
                  do {
                    iVar19 = iVar19 + local_100[lVar11 + -1];
                    local_c8[lVar11] = iVar19;
                    lVar11 = lVar11 + 1;
                  } while (lVar10 != lVar11);
                }
                local_110 = (int)lVar11;
                pRVar9 = local_108;
                local_d0 = pvVar13;
                if (ref_cell->max < 1) {
                  iVar19 = 0;
                }
                else {
                  iVar19 = 0;
                  do {
                    RVar7 = ref_cell_nodes(ref_cell,iVar19,local_a8);
                    if (RVar7 == 0) {
                      uVar8 = ref_cell_part(ref_cell,local_f0,iVar19,&local_110);
                      if (uVar8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                               ,0x58e,"ref_cell_ghost_long",(ulong)uVar8,"cell part");
                        return uVar8;
                      }
                      pRVar9 = local_108;
                      if (local_110 != ref_mpi->id) {
                        iVar1 = local_c8[local_110];
                        *(int *)((long)local_d0 + (long)iVar1 * 4) = iVar19;
                        iVar2 = ref_cell->node_per;
                        if (0 < (long)iVar2) {
                          lVar10 = 0;
                          do {
                            iVar3 = local_a8[lVar10];
                            lVar11 = -1;
                            if (((-1 < (long)iVar3) && (iVar3 < local_f0->max)) &&
                               (lVar11 = local_f0->global[iVar3], lVar11 < 0)) {
                              lVar11 = -1;
                            }
                            *(long *)((long)local_e0 + lVar10 * 8 + (long)(iVar2 * iVar1) * 8) =
                                 lVar11;
                            lVar10 = lVar10 + 1;
                          } while (iVar2 != lVar10);
                        }
                        local_c8[local_110] = iVar1 + 1;
                      }
                    }
                    iVar19 = iVar19 + 1;
                  } while (iVar19 < ref_cell->max);
                }
                local_10c = iVar19;
                uVar8 = ref_mpi_alltoallv(ref_mpi,local_e0,local_100,local_f8,pRVar9,
                                          ref_cell->node_per,2);
                if (uVar8 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                         ,0x59c,"ref_cell_ghost_long",(ulong)uVar8,"alltoallv requested nodes");
                  return uVar8;
                }
                if (uVar6 != 0) {
                  local_b0 = 1;
                  if (1 < (int)uVar6) {
                    local_b0 = (ulong)uVar6;
                  }
                  uVar18 = 0;
                  do {
                    uVar14 = (ulong)(uint)ref_cell->node_per;
                    if (0 < ref_cell->node_per) {
                      lVar10 = 0;
                      do {
                        uVar6 = ref_node_local(local_f0,*(REF_GLOB *)
                                                         ((long)local_f8 +
                                                         ((int)uVar14 * (int)uVar18 + lVar10) * 8),
                                               &local_d4);
                        if (uVar6 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                                 ,0x5a1,"ref_cell_ghost_long",(ulong)uVar6,"local");
                          return uVar6;
                        }
                        local_a8[lVar10] = local_d4;
                        lVar10 = lVar10 + 1;
                        uVar14 = (ulong)ref_cell->node_per;
                      } while (lVar10 < (long)uVar14);
                    }
                    uVar6 = ref_cell_with(ref_cell,local_a8,&local_10c);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                             ,0x5a4,"ref_cell_ghost_long",(ulong)uVar6,"find cell");
                      return uVar6;
                    }
                    *(REF_LONG *)((long)local_e8 + uVar18 * 8) = local_b8[local_10c];
                    uVar18 = uVar18 + 1;
                  } while (uVar18 != local_b0);
                }
                uVar6 = ref_mpi_alltoallv(ref_mpi,local_e8,local_108,local_c0,local_100,1,2);
                pvVar13 = local_c0;
                pvVar12 = local_d0;
                if (uVar6 == 0) {
                  if (uVar5 != 0) {
                    uVar18 = 1;
                    if (1 < (int)uVar5) {
                      uVar18 = (ulong)uVar5;
                    }
                    uVar14 = 0;
                    do {
                      local_b8[*(int *)((long)local_d0 + uVar14 * 4)] =
                           *(REF_LONG *)((long)local_c0 + uVar14 * 8);
                      uVar14 = uVar14 + 1;
                    } while (uVar18 != uVar14);
                  }
                  free(local_c8);
                  free(local_e8);
                  free(local_f8);
                  free(pvVar12);
                  free(pvVar13);
                  free(local_e0);
                  if (local_108 != (REF_INT *)0x0) {
                    free(local_108);
                  }
                  if (local_100 != (REF_INT *)0x0) {
                    free(local_100);
                  }
                  return 0;
                }
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c"
                       ,0x5aa,"ref_cell_ghost_long",(ulong)uVar6,"alltoallv return data");
                return uVar6;
              }
              pcVar16 = "malloc a_next of REF_INT NULL";
              uVar15 = 0x588;
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar15,
           "ref_cell_ghost_long",pcVar16);
    RVar7 = 2;
  }
  return RVar7;
}

Assistant:

REF_FCN REF_STATUS ref_cell_ghost_long(REF_CELL ref_cell, REF_NODE ref_node,
                                       REF_LONG *data) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT cell;
  REF_INT part;
  REF_INT *a_next, *a_cell;
  REF_GLOB *a_nodes, *b_nodes;
  REF_LONG *a_data, *b_data;

  REF_INT cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB global;
  REF_INT local;
  REF_INT request;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, ref_cell_node_per(ref_cell) * a_total, REF_GLOB);
  ref_malloc(a_data, a_total, REF_LONG);
  ref_malloc(a_cell, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, ref_cell_node_per(ref_cell) * b_total, REF_GLOB);
  ref_malloc(b_data, b_total, REF_LONG);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_cell[a_next[part]] = cell;
      for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
           cell_node++) {
        a_nodes[cell_node + ref_cell_node_per(ref_cell) * a_next[part]] =
            ref_node_global(ref_node, nodes[cell_node]);
      }
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size,
                        ref_cell_node_per(ref_cell), REF_GLOB_TYPE),
      "alltoallv requested nodes");

  for (request = 0; request < b_total; request++) {
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      global = b_nodes[cell_node + ref_cell_node_per(ref_cell) * request];
      RSS(ref_node_local(ref_node, global, &(local)), "local");
      nodes[cell_node] = local;
    }
    RSS(ref_cell_with(ref_cell, nodes, &cell), "find cell");
    b_data[request] = data[cell];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, 1,
                        REF_LONG_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    data[a_cell[request]] = a_data[request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_cell);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}